

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int apply_robot_params(void)

{
  int iVar1;
  undefined1 local_18 [4];
  int local_14;
  int age;
  int version;
  int j;
  
  yprintf(OUTPUT_LV_INFO,"Applying parameters.\n");
  for (age = 0; age < 0x10; age = age + 1) {
    if (g_param.motor_enable[age] != 0) {
      parameter_set('A',(char)age,0x4b0);
    }
  }
  if (g_param_init != 0) {
    for (age = 0; age < 0x10; age = age + 1) {
      if (g_param.motor_enable[age] != 0) {
        parameter_set('\0',(char)age,0);
      }
    }
    g_param_init = 0;
  }
  if (9 < g_param.device_version) {
    __isoc99_sscanf("YPP:11:05","YPP:%d:%d",&local_14,local_18);
    for (age = 0; age < 0x10; age = age + 1) {
      if (g_param.motor_enable[age] != 0) {
        parameter_set('d',(char)age,(long)local_14);
      }
    }
  }
  iVar1 = set_param_motor();
  if (iVar1 < 1) {
    version = 0;
  }
  else {
    yp_usleep(30000);
    iVar1 = set_param_velocity();
    if (iVar1 < 1) {
      version = 0;
    }
    else {
      yp_usleep(100000);
      version = 1;
    }
  }
  return version;
}

Assistant:

int apply_robot_params()
{
  yprintf(OUTPUT_LV_INFO, "Applying parameters.\n");

  int j;
  // ウォッチドックタイマの設定
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (g_param.motor_enable[j])
      parameter_set(PARAM_watch_dog_limit, j, 1200);
  }

  if (g_param_init)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (g_param.motor_enable[j])
        parameter_set(PARAM_w_ref, j, 0);
    }
    g_param_init = 0;
  }

  if (g_param.device_version >= 10)
  {
    int version, age;
    sscanf(YP_PROTOCOL_NAME, "YPP:%d:%d", &version, &age);
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (g_param.motor_enable[j])
        parameter_set(PARAM_protocol_version, j, version);
    }
  }

  /* モータのパラメータ */
  if (set_param_motor() < 1)
    return 0;
  yp_usleep(30000);

  /* 速度制御パラメータ */
  if (set_param_velocity() < 1)
    return 0;
  yp_usleep(100000);

  return 1;
}